

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O2

void tpl_model_update_b(TplParams *tpl_data,int mi_row,int mi_col,BLOCK_SIZE bsize,int frame_idx,
                       int ref)

{
  int row_b;
  int col_b;
  byte bVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  TplDepFrame *pTVar7;
  TplDepStats *pTVar8;
  TplDepStats *pTVar9;
  long recrf_dist;
  FULLPEL_MV FVar10;
  int32_t *piVar11;
  int64_t iVar12;
  byte bVar13;
  byte bVar14;
  long lVar15;
  int64_t *piVar16;
  uint row_a;
  long lVar17;
  int pix_num;
  long lVar18;
  int iVar19;
  uint col_a;
  int iVar20;
  uint uVar21;
  int width;
  int height;
  bool bVar22;
  
  pTVar7 = tpl_data->tpl_frame;
  bVar1 = tpl_data->tpl_stats_block_mis_log2;
  pTVar8 = pTVar7[(uint)frame_idx].tpl_stats_ptr;
  iVar19 = (mi_col >> (bVar1 & 0x1f)) + (mi_row >> (bVar1 & 0x1f)) * pTVar7->stride;
  lVar18 = (long)pTVar8[iVar19].ref_frame_index[(uint)ref];
  if ((-1 < lVar18) && (lVar15 = (long)pTVar7[(uint)frame_idx].ref_map_index[lVar18], -1 < lVar15))
  {
    cVar2 = pTVar8[iVar19].ref_frame_index[1];
    pTVar9 = pTVar7[lVar15].tpl_stats_ptr;
    FVar10 = get_fullmv_from_mv((MV *)(pTVar8[iVar19].mv + lVar18));
    width = 4 << (""[bsize] & 0x1f);
    height = 4 << (""[bsize] & 0x1f);
    row_b = (int)FVar10.row + mi_row * 4;
    bVar13 = ""[bsize] + 2;
    col_b = ((int)FVar10 >> 0x10) + mi_col * 4;
    bVar14 = ""[bsize] + 2;
    pix_num = height * width;
    bVar22 = cVar2 < '\0';
    bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bsize];
    bVar4 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
    piVar16 = pTVar8[iVar19].cmp_recrf_dist + (ref == 0);
    if (bVar22) {
      piVar16 = &pTVar8[iVar19].srcrf_dist;
    }
    piVar11 = pTVar8[iVar19].cmp_recrf_rate + (ref == 0);
    if (bVar22) {
      piVar11 = &pTVar8[iVar19].srcrf_rate;
    }
    iVar5 = *piVar11;
    lVar18 = pTVar8[iVar19].mc_dep_dist;
    iVar6 = pTVar8[iVar19].recrf_rate;
    recrf_dist = pTVar8[iVar19].recrf_dist;
    lVar17 = recrf_dist - *piVar16;
    iVar12 = av1_delta_rate_cost(pTVar8[iVar19].mc_dep_rate,recrf_dist,*piVar16,pix_num);
    for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
      row_a = ((uVar21 >> 1) + (row_b >> (bVar13 & 0x1f))) * height;
      iVar19 = 0;
      if ((uVar21 & 1) != 0) {
        iVar19 = width;
      }
      if ((((-1 < (int)row_a) && ((int)row_a < pTVar7[lVar15].mi_rows * 4)) &&
          (col_a = iVar19 + (col_b >> (bVar14 & 0x1f)) * width, -1 < (int)col_a)) &&
         ((int)col_a < pTVar7[lVar15].mi_cols * 4)) {
        iVar19 = av1_get_overlap_area(row_a,col_a,row_b,col_b,width,height);
        iVar20 = ((col_a >> (bVar14 & 0x1f)) * (uint)bVar4 >> (bVar1 & 0x1f)) +
                 ((row_a >> (bVar13 & 0x1f)) * (uint)bVar3 >> (bVar1 & 0x1f)) *
                 pTVar7[lVar15].stride;
        piVar16 = &pTVar9[iVar20].mc_dep_dist;
        *piVar16 = *piVar16 +
                   (((long)(((double)lVar17 / (double)recrf_dist) * (double)lVar18) + lVar17) *
                   (long)iVar19) / (long)pix_num;
        piVar16 = &pTVar9[iVar20].mc_dep_rate;
        *piVar16 = *piVar16 +
                   ((long)iVar19 * (iVar12 + ((long)(iVar6 << 4) - (long)(iVar5 << 4)))) /
                   (long)pix_num;
      }
    }
  }
  return;
}

Assistant:

static inline void tpl_model_update_b(TplParams *const tpl_data, int mi_row,
                                      int mi_col, const BLOCK_SIZE bsize,
                                      int frame_idx, int ref) {
  TplDepFrame *tpl_frame_ptr = &tpl_data->tpl_frame[frame_idx];
  TplDepStats *tpl_ptr = tpl_frame_ptr->tpl_stats_ptr;
  TplDepFrame *tpl_frame = tpl_data->tpl_frame;
  const uint8_t block_mis_log2 = tpl_data->tpl_stats_block_mis_log2;
  TplDepStats *tpl_stats_ptr = &tpl_ptr[av1_tpl_ptr_pos(
      mi_row, mi_col, tpl_frame->stride, block_mis_log2)];

  int is_compound = tpl_stats_ptr->ref_frame_index[1] >= 0;

  if (tpl_stats_ptr->ref_frame_index[ref] < 0) return;
  const int ref_frame_index = tpl_stats_ptr->ref_frame_index[ref];
  TplDepFrame *ref_tpl_frame =
      &tpl_frame[tpl_frame[frame_idx].ref_map_index[ref_frame_index]];
  TplDepStats *ref_stats_ptr = ref_tpl_frame->tpl_stats_ptr;

  if (tpl_frame[frame_idx].ref_map_index[ref_frame_index] < 0) return;

  const FULLPEL_MV full_mv =
      get_fullmv_from_mv(&tpl_stats_ptr->mv[ref_frame_index].as_mv);
  const int ref_pos_row = mi_row * MI_SIZE + full_mv.row;
  const int ref_pos_col = mi_col * MI_SIZE + full_mv.col;

  const int bw = 4 << mi_size_wide_log2[bsize];
  const int bh = 4 << mi_size_high_log2[bsize];
  const int mi_height = mi_size_high[bsize];
  const int mi_width = mi_size_wide[bsize];
  const int pix_num = bw * bh;

  // top-left on grid block location in pixel
  int grid_pos_row_base = round_floor(ref_pos_row, bh) * bh;
  int grid_pos_col_base = round_floor(ref_pos_col, bw) * bw;
  int block;

  int64_t srcrf_dist = is_compound ? tpl_stats_ptr->cmp_recrf_dist[!ref]
                                   : tpl_stats_ptr->srcrf_dist;
  int64_t srcrf_rate =
      is_compound
          ? (tpl_stats_ptr->cmp_recrf_rate[!ref] << TPL_DEP_COST_SCALE_LOG2)
          : (tpl_stats_ptr->srcrf_rate << TPL_DEP_COST_SCALE_LOG2);

  int64_t cur_dep_dist = tpl_stats_ptr->recrf_dist - srcrf_dist;
  int64_t mc_dep_dist =
      (int64_t)(tpl_stats_ptr->mc_dep_dist *
                ((double)(tpl_stats_ptr->recrf_dist - srcrf_dist) /
                 tpl_stats_ptr->recrf_dist));
  int64_t delta_rate =
      (tpl_stats_ptr->recrf_rate << TPL_DEP_COST_SCALE_LOG2) - srcrf_rate;
  int64_t mc_dep_rate =
      av1_delta_rate_cost(tpl_stats_ptr->mc_dep_rate, tpl_stats_ptr->recrf_dist,
                          srcrf_dist, pix_num);

  for (block = 0; block < 4; ++block) {
    int grid_pos_row = grid_pos_row_base + bh * (block >> 1);
    int grid_pos_col = grid_pos_col_base + bw * (block & 0x01);

    if (grid_pos_row >= 0 && grid_pos_row < ref_tpl_frame->mi_rows * MI_SIZE &&
        grid_pos_col >= 0 && grid_pos_col < ref_tpl_frame->mi_cols * MI_SIZE) {
      int overlap_area = av1_get_overlap_area(grid_pos_row, grid_pos_col,
                                              ref_pos_row, ref_pos_col, bw, bh);
      int ref_mi_row = round_floor(grid_pos_row, bh) * mi_height;
      int ref_mi_col = round_floor(grid_pos_col, bw) * mi_width;
      assert((1 << block_mis_log2) == mi_height);
      assert((1 << block_mis_log2) == mi_width);
      TplDepStats *des_stats = &ref_stats_ptr[av1_tpl_ptr_pos(
          ref_mi_row, ref_mi_col, ref_tpl_frame->stride, block_mis_log2)];
      des_stats->mc_dep_dist +=
          ((cur_dep_dist + mc_dep_dist) * overlap_area) / pix_num;
      des_stats->mc_dep_rate +=
          ((delta_rate + mc_dep_rate) * overlap_area) / pix_num;
    }
  }
}